

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# globals.cc
# Opt level: O3

void __thiscall
absl::lts_20240722::log_internal::ScopedMinLogLevel::~ScopedMinLogLevel(ScopedMinLogLevel *this)

{
  _ZN4absl12lts_2024072212_GLOBAL__N_113min_log_levelE_0 = this->saved_severity_;
  if ((anonymous_namespace)::logging_globals_listener != (undefined *)0x0 &&
      (code *)(anonymous_namespace)::logging_globals_listener !=
      base_internal::AtomicHook<void_(*)()>::DummyFunction) {
    (*(code *)(anonymous_namespace)::logging_globals_listener)();
  }
  return;
}

Assistant:

ScopedMinLogLevel::~ScopedMinLogLevel() {
  absl::SetMinLogLevel(saved_severity_);
}